

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__encode_uint8_linear_scaled_AR(void *outputp,int width_times_channels,float *encode)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uchar *puVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  __m128 e0_2;
  __m128i b_1;
  __m128i a_1;
  __m128 bf_1;
  __m128 af_1;
  __m128i i0;
  __m128 e0_1;
  __m128i b;
  __m128i a;
  __m128 bf;
  __m128 af;
  __m128i i;
  __m128 e1;
  __m128 e0;
  float *end_encode_m8;
  uchar *end_output;
  uchar *output;
  float *encode_local;
  int width_times_channels_local;
  void *outputp_local;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  short local_298;
  short sStack_296;
  short sStack_294;
  short sStack_292;
  short local_278;
  short sStack_276;
  short sStack_274;
  short sStack_272;
  short sStack_270;
  short sStack_26e;
  short sStack_26c;
  short sStack_26a;
  float local_1a8;
  float local_198;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  uchar local_108;
  undefined8 local_b8;
  undefined8 local_98;
  
  puVar16 = (uchar *)((long)outputp + (long)width_times_channels);
  if (width_times_channels < 8) {
    output = (uchar *)encode;
    for (end_output = (uchar *)((long)outputp + 4); end_output <= puVar16;
        end_output = end_output + 4) {
      local_4c8 = (float)*(undefined8 *)output;
      fStack_4c4 = (float)((ulong)*(undefined8 *)output >> 0x20);
      fStack_4c0 = (float)*(undefined8 *)(output + 8);
      fStack_4bc = (float)((ulong)*(undefined8 *)(output + 8) >> 0x20);
      uVar1 = CONCAT44(local_4c8 * 255.0 + 0.5,fStack_4c4 * 255.0 + 0.5);
      uVar2 = CONCAT44(fStack_4c0 * 255.0 + 0.5,fStack_4bc * 255.0 + 0.5);
      auVar7._8_8_ = uVar2;
      auVar7._0_8_ = uVar1;
      auVar20._8_8_ = 0x437f0000437f0000;
      auVar20._0_8_ = 0x437f0000437f0000;
      auVar20 = minps(auVar7,auVar20);
      auVar19._8_8_ = uVar2;
      auVar19._0_8_ = uVar1;
      auVar18._8_8_ = 0x437f0000437f0000;
      auVar18._0_8_ = 0x437f0000437f0000;
      auVar18 = minps(auVar19,auVar18);
      auVar19 = maxps(auVar20,ZEXT816(0));
      auVar18 = maxps(auVar18,ZEXT816(0));
      local_178 = auVar19._0_4_;
      fStack_174 = auVar19._4_4_;
      fStack_170 = auVar19._8_4_;
      fStack_16c = auVar19._12_4_;
      b_1[1] = CONCAT44((int)fStack_174,(int)local_178);
      a_1[0]._0_4_ = (int)fStack_170;
      a_1[0]._4_4_ = (int)fStack_16c;
      local_188 = auVar18._0_4_;
      fStack_184 = auVar18._4_4_;
      fStack_180 = auVar18._8_4_;
      fStack_17c = auVar18._12_4_;
      auVar12._4_4_ = (int)fStack_184;
      auVar12._0_4_ = (int)local_188;
      auVar12._12_4_ = (int)fStack_17c;
      auVar12._8_4_ = (int)fStack_180;
      auVar13._8_8_ = a_1[0];
      auVar13._0_8_ = b_1[1];
      auVar18 = packssdw(auVar13,auVar12);
      local_298 = auVar18._0_2_;
      sStack_296 = auVar18._2_2_;
      sStack_294 = auVar18._4_2_;
      sStack_292 = auVar18._6_2_;
      *(uint *)(end_output + -4) =
           CONCAT13((0 < sStack_292) * (sStack_292 < 0x100) * auVar18[6] - (0xff < sStack_292),
                    CONCAT12((0 < sStack_294) * (sStack_294 < 0x100) * auVar18[4] -
                             (0xff < sStack_294),
                             CONCAT11((0 < sStack_296) * (sStack_296 < 0x100) * auVar18[2] -
                                      (0xff < sStack_296),
                                      (0 < local_298) * (local_298 < 0x100) * auVar18[0] -
                                      (0xff < local_298))));
      output = output + 0x10;
    }
    for (end_output = end_output + -4; end_output < puVar16; end_output = end_output + 2) {
      local_98 = CONCAT44(0x3f000000,*(float *)(output + 4) * 255.0 + 0.5);
      auVar6._8_8_ = 0x3f0000003f000000;
      auVar6._0_8_ = local_98;
      auVar5._8_8_ = 0x437f0000437f0000;
      auVar5._0_8_ = 0x437f0000437f0000;
      auVar18 = minps(auVar6,auVar5);
      auVar18 = maxps(auVar18,ZEXT816(0));
      local_198 = auVar18._0_4_;
      local_108 = (uchar)(int)local_198;
      *end_output = local_108;
      local_b8 = CONCAT44(0x3f000000,*(float *)output * 255.0 + 0.5);
      auVar4._8_8_ = 0x3f0000003f000000;
      auVar4._0_8_ = local_b8;
      auVar3._8_8_ = 0x437f0000437f0000;
      auVar3._0_8_ = 0x437f0000437f0000;
      auVar18 = minps(auVar4,auVar3);
      auVar18 = maxps(auVar18,ZEXT816(0));
      local_1a8 = auVar18._0_4_;
      end_output[1] = (uchar)(int)local_1a8;
      output = output + 8;
    }
  }
  else {
    end_output = (uchar *)outputp;
    output = (uchar *)encode;
    do {
      do {
        local_488 = (float)*(undefined8 *)output;
        fStack_484 = (float)((ulong)*(undefined8 *)output >> 0x20);
        fStack_480 = (float)*(undefined8 *)(output + 8);
        fStack_47c = (float)((ulong)*(undefined8 *)(output + 8) >> 0x20);
        local_4a8 = (float)*(undefined8 *)(output + 0x10);
        fStack_4a4 = (float)((ulong)*(undefined8 *)(output + 0x10) >> 0x20);
        fStack_4a0 = (float)*(undefined8 *)(output + 0x18);
        fStack_49c = (float)((ulong)*(undefined8 *)(output + 0x18) >> 0x20);
        auVar11._4_4_ = local_488 * 255.0 + 0.5;
        auVar11._0_4_ = fStack_484 * 255.0 + 0.5;
        auVar11._12_4_ = fStack_480 * 255.0 + 0.5;
        auVar11._8_4_ = fStack_47c * 255.0 + 0.5;
        auVar9._4_4_ = local_4a8 * 255.0 + 0.5;
        auVar9._0_4_ = fStack_4a4 * 255.0 + 0.5;
        auVar9._12_4_ = fStack_4a0 * 255.0 + 0.5;
        auVar9._8_4_ = fStack_49c * 255.0 + 0.5;
        auVar10._8_8_ = 0x437f0000437f0000;
        auVar10._0_8_ = 0x437f0000437f0000;
        auVar19 = minps(auVar11,auVar10);
        auVar8._8_8_ = 0x437f0000437f0000;
        auVar8._0_8_ = 0x437f0000437f0000;
        auVar18 = minps(auVar9,auVar8);
        auVar19 = maxps(auVar19,ZEXT816(0));
        auVar18 = maxps(auVar18,ZEXT816(0));
        local_158 = auVar19._0_4_;
        fStack_154 = auVar19._4_4_;
        fStack_150 = auVar19._8_4_;
        fStack_14c = auVar19._12_4_;
        b[1] = CONCAT44((int)fStack_154,(int)local_158);
        a[0]._0_4_ = (int)fStack_150;
        a[0]._4_4_ = (int)fStack_14c;
        local_168 = auVar18._0_4_;
        fStack_164 = auVar18._4_4_;
        fStack_160 = auVar18._8_4_;
        fStack_15c = auVar18._12_4_;
        auVar14._4_4_ = (int)fStack_164;
        auVar14._0_4_ = (int)local_168;
        auVar14._12_4_ = (int)fStack_15c;
        auVar14._8_4_ = (int)fStack_160;
        auVar15._8_8_ = a[0];
        auVar15._0_8_ = b[1];
        auVar18 = packssdw(auVar15,auVar14);
        local_278 = auVar18._0_2_;
        sStack_276 = auVar18._2_2_;
        sStack_274 = auVar18._4_2_;
        sStack_272 = auVar18._6_2_;
        sStack_270 = auVar18._8_2_;
        sStack_26e = auVar18._10_2_;
        sStack_26c = auVar18._12_2_;
        sStack_26a = auVar18._14_2_;
        *(ulong *)end_output =
             CONCAT17((0 < sStack_26a) * (sStack_26a < 0x100) * auVar18[0xe] - (0xff < sStack_26a),
                      CONCAT16((0 < sStack_26c) * (sStack_26c < 0x100) * auVar18[0xc] -
                               (0xff < sStack_26c),
                               CONCAT15((0 < sStack_26e) * (sStack_26e < 0x100) * auVar18[10] -
                                        (0xff < sStack_26e),
                                        CONCAT14((0 < sStack_270) * (sStack_270 < 0x100) *
                                                 auVar18[8] - (0xff < sStack_270),
                                                 CONCAT13((0 < sStack_272) * (sStack_272 < 0x100) *
                                                          auVar18[6] - (0xff < sStack_272),
                                                          CONCAT12((0 < sStack_274) *
                                                                   (sStack_274 < 0x100) * auVar18[4]
                                                                   - (0xff < sStack_274),
                                                                   CONCAT11((0 < sStack_276) *
                                                                            (sStack_276 < 0x100) *
                                                                            auVar18[2] -
                                                                            (0xff < sStack_276),
                                                                            (0 < local_278) *
                                                                            (local_278 < 0x100) *
                                                                            auVar18[0] -
                                                                            (0xff < local_278)))))))
                     );
        output = output + 0x20;
        end_output = end_output + 8;
      } while (end_output <= puVar16 + -8);
      bVar17 = end_output != puVar16;
      end_output = puVar16 + -8;
      output = (uchar *)(encode + (long)width_times_channels + -8);
    } while (bVar17);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_uint8_linear_scaled )( void * outputp, int width_times_channels, float const * encode )
{
  unsigned char STBIR_SIMD_STREAMOUT_PTR( * ) output = (unsigned char *) outputp;
  unsigned char * end_output = ( (unsigned char *) output ) + width_times_channels;

  #ifdef STBIR_SIMD
  if ( width_times_channels >= stbir__simdfX_float_count*2 )
  {
    float const * end_encode_m8 = encode + width_times_channels - stbir__simdfX_float_count*2;
    end_output -= stbir__simdfX_float_count*2;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      stbir__simdfX e0, e1;
      stbir__simdi i;
      STBIR_SIMD_NO_UNROLL(encode);
      stbir__simdfX_madd_mem( e0, STBIR_simd_point5X, STBIR_max_uint8_as_floatX, encode );
      stbir__simdfX_madd_mem( e1, STBIR_simd_point5X, STBIR_max_uint8_as_floatX, encode+stbir__simdfX_float_count );
      stbir__encode_simdfX_unflip( e0 );
      stbir__encode_simdfX_unflip( e1 );
      #ifdef STBIR_SIMD8
      stbir__simdf8_pack_to_16bytes( i, e0, e1 );
      stbir__simdi_store( output, i );
      #else
      stbir__simdf_pack_to_8bytes( i, e0, e1 );
      stbir__simdi_store2( output, i );
      #endif
      encode += stbir__simdfX_float_count*2;
      output += stbir__simdfX_float_count*2;
      if ( output <= end_output )
        continue;
      if ( output == ( end_output + stbir__simdfX_float_count*2 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m8;
    }
    return;
  }

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    stbir__simdf e0;
    stbir__simdi i0;
    STBIR_NO_UNROLL(encode);
    stbir__simdf_load( e0, encode );
    stbir__simdf_madd( e0, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint8_as_float), e0 );
    stbir__encode_simdf4_unflip( e0 );
    stbir__simdf_pack_to_8bytes( i0, e0, e0 );  // only use first 4
    *(int*)(output-4) = stbir__simdi_to_int( i0 );
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    stbir__simdf e0;
    STBIR_NO_UNROLL(encode);
    stbir__simdf_madd1_mem( e0, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint8_as_float), encode+stbir__encode_order0 ); output[0] = stbir__simdf_convert_float_to_uint8( e0 );
    #if stbir__coder_min_num >= 2
    stbir__simdf_madd1_mem( e0, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint8_as_float), encode+stbir__encode_order1 ); output[1] = stbir__simdf_convert_float_to_uint8( e0 );
    #endif
    #if stbir__coder_min_num >= 3
    stbir__simdf_madd1_mem( e0, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint8_as_float), encode+stbir__encode_order2 ); output[2] = stbir__simdf_convert_float_to_uint8( e0 );
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif

  #else

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  while( output <= end_output )
  {
    float f;
    f = encode[stbir__encode_order0] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[0-4] = (unsigned char)f;
    f = encode[stbir__encode_order1] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[1-4] = (unsigned char)f;
    f = encode[stbir__encode_order2] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[2-4] = (unsigned char)f;
    f = encode[stbir__encode_order3] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[3-4] = (unsigned char)f;
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    float f;
    STBIR_NO_UNROLL(encode);
    f = encode[stbir__encode_order0] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[0] = (unsigned char)f;
    #if stbir__coder_min_num >= 2
    f = encode[stbir__encode_order1] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[1] = (unsigned char)f;
    #endif
    #if stbir__coder_min_num >= 3
    f = encode[stbir__encode_order2] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[2] = (unsigned char)f;
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
  #endif
}